

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Elf64.cpp
# Opt level: O0

Elf64_Ehdr * elf::arch64::GetHeader(void *data)

{
  uint8_t uVar1;
  Elf64_Ehdr *ret;
  void *data_local;
  
  if (*data == 0x464c457f) {
    uVar1 = GetClass(data);
    data_local = data;
    if (uVar1 != '\x02') {
      data_local = (void *)0x0;
    }
  }
  else {
    data_local = (void *)0x0;
  }
  return (Elf64_Ehdr *)data_local;
}

Assistant:

Elf64_Ehdr* elf::arch64::GetHeader(void* data) {
    Elf64_Ehdr* ret = (Elf64_Ehdr*) data;

    if(memcmp(ret->e_ident, ELFMAG, SELFMAG) != 0)
        return NULL; // Invalid ELF

    if(GetClass(data) != ELFCLASS64)
        return NULL; // x64 only

    return ret;
}